

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCompElH1.cpp
# Opt level: O3

void __thiscall
TPZCompElH1<pzshape::TPZShapePrism>::SetSideOrder
          (TPZCompElH1<pzshape::TPZShapePrism> *this,int side,int order)

{
  TPZCompElSide *pTVar1;
  undefined8 uVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  ostream *this_00;
  long *plVar6;
  long lVar7;
  TPZCompMesh *pTVar8;
  int64_t iVar9;
  TPZGeoElSide gelside;
  TPZStack<TPZCompElSide,_10> equal;
  TPZGeoElSide local_108;
  TPZStack<TPZCompElSide,_10> local_f0;
  
  if (((uint)side < 0x15) && (0 < order || (uint)side < 6)) {
    if ((5 < (uint)side) && ((this->fConnectIndexes).super_TPZVec<long>.fStore[side] != -1)) {
      iVar3 = (this->super_TPZIntelGen<pzshape::TPZShapePrism>).super_TPZInterpolatedElement.
              super_TPZInterpolationSpace.fPreferredOrder;
      lVar7 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapePrism>).
                                     super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                     super_TPZCompEl + 0xa0))(this,0x14);
      if (lVar7 != -1) {
        iVar3 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapePrism>).
                                       super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                       super_TPZCompEl + 0x338))(this,0x14);
      }
      lVar7 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapePrism>).
                                     super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                     super_TPZCompEl + 0xa8))(this,side);
      if ((uint)*(byte *)(lVar7 + 0x14) != order) {
        (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapePrism>).
                               super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                               super_TPZCompEl + 0xa0))(this,side);
        *(char *)(lVar7 + 0x14) = (char)order;
        uVar2 = *(undefined8 *)(lVar7 + 8);
        plVar6 = (long *)(**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapePrism>).
                                                super_TPZInterpolatedElement.
                                                super_TPZInterpolationSpace.super_TPZCompEl + 0xb8))
                                   (this);
        if (plVar6 == (long *)0x0) {
          iVar5 = pzshape::TPZShapePrism::NConnectShapeF(side,order);
          *(int *)(lVar7 + 0x18) = iVar5;
          uVar4 = 1;
        }
        else {
          uVar4 = (**(code **)(*plVar6 + 0x78))(plVar6);
          iVar5 = pzshape::TPZShapePrism::NConnectShapeF(side,order);
          *(int *)(lVar7 + 0x18) = iVar5;
          if (0xff < uVar4) {
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/pzconnect.h"
                       ,0xc6);
          }
        }
        *(char *)(lVar7 + 0x15) = (char)uVar4;
        pTVar8 = TPZCompEl::Mesh((TPZCompEl *)this);
        TPZBlock::Set(&pTVar8->fBlock,(int)uVar2,iVar5 * uVar4,-1);
        local_108.fGeoEl = TPZCompEl::Reference((TPZCompEl *)this);
        local_108.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZGeoElSide_018f8760;
        lVar7 = 0x28;
        do {
          *(undefined8 *)
           ((long)local_f0.super_TPZManVector<TPZCompElSide,_10>.fExtAlloc + lVar7 + -0x28) = 0;
          *(undefined4 *)
           ((long)&(((TPZManVector<TPZCompElSide,_10> *)
                    (local_f0.super_TPZManVector<TPZCompElSide,_10>.fExtAlloc + -2))->
                   super_TPZVec<TPZCompElSide>)._vptr_TPZVec + lVar7) = 0xffffffff;
          lVar7 = lVar7 + 0x10;
        } while (lVar7 != 200);
        pTVar1 = local_f0.super_TPZManVector<TPZCompElSide,_10>.fExtAlloc;
        local_f0.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.fNElements = 0;
        local_f0.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.fNAlloc = 0;
        local_f0.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>._vptr_TPZVec =
             (_func_int **)&PTR__TPZManVector_0181a690;
        local_108.fSide = side;
        local_f0.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.fStore = pTVar1;
        TPZGeoElSide::EqualLevelCompElementList(&local_108,&local_f0,1,0);
        if (0 < local_f0.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.
                fNElements) {
          lVar7 = 0;
          iVar9 = local_f0.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.
                  fNElements;
          do {
            plVar6 = (long *)__dynamic_cast(*(undefined8 *)
                                             ((long)&(local_f0.super_TPZManVector<TPZCompElSide,_10>
                                                      .super_TPZVec<TPZCompElSide>.fStore)->fEl +
                                             lVar7),&TPZCompEl::typeinfo,
                                            &TPZInterpolatedElement::typeinfo,0);
            (**(code **)(*plVar6 + 0x270))(plVar6);
            lVar7 = lVar7 + 0x10;
            iVar9 = iVar9 + -1;
          } while (iVar9 != 0);
        }
        if (local_f0.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.fStore !=
            pTVar1) {
          local_f0.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.fNAlloc = 0;
          local_f0.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>._vptr_TPZVec =
               (_func_int **)&PTR__TPZVec_018142b0;
          if (local_f0.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.fStore !=
              (TPZCompElSide *)0x0) {
            operator_delete__(local_f0.super_TPZManVector<TPZCompElSide,_10>.
                              super_TPZVec<TPZCompElSide>.fStore);
          }
        }
      }
      lVar7 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapePrism>).
                                     super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                     super_TPZCompEl + 0xa0))(this,0x14);
      if ((lVar7 != -1) &&
         (iVar5 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapePrism>).
                                         super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                         super_TPZCompEl + 0x338))(this,0x14), iVar5 != iVar3)) {
        (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapePrism>).
                               super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                               super_TPZCompEl + 0x270))(this);
      }
    }
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"TPZIntelGen::SetSideOrder. Bad paramenter side ",0x2f);
  this_00 = (ostream *)std::ostream::operator<<(&std::cerr,side);
  std::__ostream_insert<char,std::char_traits<char>>(this_00," order ",7);
  plVar6 = (long *)std::ostream::operator<<(this_00,order);
  std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
  std::ostream::put((char)plVar6);
  std::ostream::flush();
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/TPZCompElH1.cpp"
             ,0xa8);
}

Assistant:

void TPZCompElH1<TSHAPE>::SetSideOrder(int side, int order) {
	if(side<0 || side >= TSHAPE::NSides || (side >= TSHAPE::NCornerNodes && order <1)) {
		PZError << "TPZIntelGen::SetSideOrder. Bad paramenter side " << side << " order " << order << std::endl;
		DebugStop();
#ifdef PZ_LOG
		std::stringstream sout;
		sout << __PRETTY_FUNCTION__ << " Bad side or order " << side << " order " << order;
		LOGPZ_ERROR(logger,sout.str())
#endif
		return;
	}
	if(side>= TSHAPE::NCornerNodes) {
		if(fConnectIndexes[side] == -1) return;
        int prevorder = this->fPreferredOrder;
        if (this->ConnectIndex(TSHAPE::NSides-1) != -1) {
            prevorder = EffectiveSideOrder(TSHAPE::NSides-1);
        }
		TPZConnect &c = this->Connect(side);
        int previousconnectorder = c.Order();
        if (order != previousconnectorder)
        {
            c.SetOrder(order,this->ConnectIndex(side));
            int64_t seqnum = c.SequenceNumber();
            int nvar = 1;
            TPZMaterial * mat = this->Material();
            if(mat) nvar = mat->NStateVariables();
            int nshape = TSHAPE::NConnectShapeF(side, order);
            c.SetNShape(nshape);
            c.SetNState(nvar);
            this->Mesh()->Block().Set(seqnum,nshape*nvar);
            TPZGeoElSide gelside(this->Reference(),side);
            TPZStack<TPZCompElSide> equal;
            gelside.EqualLevelCompElementList(equal, 1, 0);
            int64_t neq = equal.size();
            for (int64_t eq=0; eq<neq; eq++) {
                TPZInterpolatedElement *intel = dynamic_cast<TPZInterpolatedElement*>(equal[eq].Element());
                intel->AdjustIntegrationRule();
            }
        }
        
        int neworder = prevorder;
        if (this->ConnectIndex(TSHAPE::NSides-1) != -1) {
            neworder = EffectiveSideOrder(TSHAPE::NSides-1);
        }
		if(neworder != prevorder) {
            this->AdjustIntegrationRule();
		}
	}
}